

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxReporters.cpp
# Opt level: O2

void __thiscall ApprovalTests::Linux::LinuxDiffReporter::LinuxDiffReporter(LinuxDiffReporter *this)

{
  BeyondCompareReporter *this_00;
  MeldReporter *this_01;
  SublimeMergeReporter *this_02;
  KDiff3Reporter *this_03;
  initializer_list<ApprovalTests::Reporter_*> __l;
  allocator_type local_49;
  _Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> local_48;
  BeyondCompareReporter *local_30;
  MeldReporter *local_28;
  SublimeMergeReporter *local_20;
  KDiff3Reporter *local_18;
  
  this_00 = (BeyondCompareReporter *)operator_new(0x70);
  BeyondCompareReporter::BeyondCompareReporter(this_00);
  local_30 = this_00;
  this_01 = (MeldReporter *)operator_new(0x70);
  MeldReporter::MeldReporter(this_01);
  local_28 = this_01;
  this_02 = (SublimeMergeReporter *)operator_new(0x20);
  SublimeMergeReporter::SublimeMergeReporter(this_02);
  local_20 = this_02;
  this_03 = (KDiff3Reporter *)operator_new(0x70);
  KDiff3Reporter::KDiff3Reporter(this_03);
  __l._M_len = 4;
  __l._M_array = (iterator)&local_30;
  local_18 = this_03;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            ((vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
             &local_48,__l,&local_49);
  FirstWorkingReporter::FirstWorkingReporter
            (&this->super_FirstWorkingReporter,
             (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
             &local_48);
  ::std::_Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::
  ~_Vector_base(&local_48);
  (this->super_FirstWorkingReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__FirstWorkingReporter_001a2f18;
  return;
}

Assistant:

LinuxDiffReporter::LinuxDiffReporter()
            : FirstWorkingReporter({
                  // begin-snippet: linux_diff_reporters
                  new BeyondCompareReporter(),
                  new MeldReporter(),
                  new SublimeMergeReporter(),
                  new KDiff3Reporter()
                  // end-snippet
              })
        {
        }